

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O0

FilterSample __thiscall pbrt::FilterSampler::Sample(FilterSampler *this,Point2f *u)

{
  Point2f PVar1;
  undefined8 uVar2;
  bool bVar3;
  FilterSample FVar4;
  int iVar5;
  float *pfVar6;
  Vector2<float> *in_RDI;
  Array2D<float> *this_00;
  float val;
  undefined1 auVar11 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Point2i pi;
  Point2f p01;
  Point2f p;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar12;
  Float *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  PiecewiseConstant2D *in_stack_ffffffffffffffb8;
  Point2i local_40;
  uint local_30;
  uint local_2c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar9._0_8_ = PiecewiseConstant2D::Sample
                           (in_stack_ffffffffffffffb8,
                            (Point2f *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,in_stack_ffffffffffffffa8);
  auVar9._8_56_ = extraout_var;
  PVar1.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar9._0_16_);
  auVar10._0_8_ =
       Bounds2<float>::Offset
                 ((Bounds2<float> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                  (Point2<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  auVar10._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar10._0_16_);
  Point2<float>::Point2<float>
            ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
  auVar11 = (undefined1  [12])0x0;
  this_00 = (Array2D<float> *)(in_RDI + 2);
  iVar5 = Array2D<float>::xSize(this_00);
  auVar7._0_4_ = (float)iVar5;
  auVar7._4_12_ = auVar11;
  uVar12 = 0x3f000000;
  auVar7 = vfmadd213ss_fma(auVar7,ZEXT416(local_30),SUB6416(ZEXT464(0x3f000000),0));
  val = auVar7._0_4_;
  iVar5 = Array2D<float>::xSize(this_00);
  Clamp<float,int,int>(val,0,iVar5 + -1);
  auVar11 = (undefined1  [12])0x0;
  iVar5 = Array2D<float>::ySize(this_00);
  auVar8._0_4_ = (float)iVar5;
  auVar8._4_12_ = auVar11;
  auVar7 = vfmadd213ss_fma(auVar8,ZEXT416(local_2c),ZEXT416(uVar12));
  iVar5 = Array2D<float>::ySize(this_00);
  Clamp<float,int,int>(auVar7._0_4_,0,iVar5 + -1);
  Point2<int>::Point2((Point2<int> *)CONCAT44(local_30,in_stack_ffffffffffffff80),
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  pfVar6 = Array2D<float>::operator[](this_00,local_40);
  uVar2 = vcmpss_avx512f(ZEXT416((uint)*pfVar6),(undefined1  [16])0x0,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  FVar4.weight = (Float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * 0x3f800000);
  FVar4.p.super_Tuple2<pbrt::Point2,_float> = PVar1.super_Tuple2<pbrt::Point2,_float>;
  return FVar4;
}

Assistant:

Sample(const Point2f &u) const {
        Point2f p = distrib.Sample(u);
        Point2f p01 = Point2f(domain.Offset(p));
        Point2i pi(Clamp(p01.x * values.xSize() + 0.5f, 0, values.xSize() - 1),
                   Clamp(p01.y * values.ySize() + 0.5f, 0, values.ySize() - 1));
        return {p, values[pi] < 0 ? -1.f : 1.f};
    }